

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_codeptr.cpp
# Opt level: O1

int AF_A_CheckForReload(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  int iVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  void *val;
  AWeapon *this;
  PClass *pPVar5;
  undefined8 uVar6;
  PClass *pPVar7;
  int iVar8;
  char *pcVar9;
  bool bVar10;
  
  pPVar5 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar9 = "(paramnum) < numparam";
    goto LAB_00653d2a;
  }
  if (((param->field_0).field_3.Type != '\x03') ||
     (((param->field_0).field_1.atag != 1 && ((param->field_0).field_1.a != (void *)0x0)))) {
LAB_00653c8a:
    pcVar9 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_00653d2a:
    __assert_fail(pcVar9,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x1206,"int AF_A_CheckForReload(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                 );
  }
  puVar3 = (undefined8 *)(param->field_0).field_1.a;
  if (puVar3 != (undefined8 *)0x0) {
    if (puVar3[1] == 0) {
      uVar6 = (**(code **)*puVar3)(puVar3);
      puVar3[1] = uVar6;
    }
    pPVar7 = (PClass *)puVar3[1];
    bVar10 = pPVar7 != (PClass *)0x0;
    if (pPVar7 != pPVar5 && bVar10) {
      do {
        pPVar7 = pPVar7->ParentClass;
        bVar10 = pPVar7 != (PClass *)0x0;
        if (pPVar7 == pPVar5) break;
      } while (pPVar7 != (PClass *)0x0);
    }
    if (!bVar10) {
      pcVar9 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_00653d2a;
    }
  }
  pPVar5 = AActor::RegistrationInfo.MyClass;
  if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
    if ((VVar1 != '\x03') ||
       ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
    goto LAB_00653c8a;
    puVar4 = (undefined8 *)param[1].field_0.field_1.a;
    if (puVar4 != (undefined8 *)0x0) {
      if (puVar4[1] == 0) {
        uVar6 = (**(code **)*puVar4)(puVar4);
        puVar4[1] = uVar6;
      }
      pPVar7 = (PClass *)puVar4[1];
      bVar10 = pPVar7 != (PClass *)0x0;
      if (pPVar7 != pPVar5 && bVar10) {
        do {
          pPVar7 = pPVar7->ParentClass;
          bVar10 = pPVar7 != (PClass *)0x0;
          if (pPVar7 == pPVar5) break;
        } while (pPVar7 != (PClass *)0x0);
      }
      if (!bVar10) {
        pcVar9 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_00653d2a;
      }
    }
  }
  if (((2 < numparam) && (VVar1 = param[2].field_0.field_3.Type, VVar1 != 0xff)) &&
     ((VVar1 != '\x03' ||
      ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))))) {
    pcVar9 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
    goto LAB_00653d2a;
  }
  if ((puVar3[0x40] == 0) || (*(long *)(puVar3[0x40] + 0xd0) == 0)) {
    if (numret < 1) {
      return 0;
    }
    if (ret != (VMReturn *)0x0) {
      VMReturn::SetPointer(ret,(void *)0x0,7);
      return 1;
    }
    __assert_fail("ret != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x120a,"int AF_A_CheckForReload(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                 );
  }
  if (numparam < 4) {
    pcVar9 = "(paramnum) < numparam";
LAB_00653cc4:
    __assert_fail(pcVar9,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x120c,"int AF_A_CheckForReload(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                 );
  }
  if (param[3].field_0.field_3.Type != '\0') {
    pcVar9 = "param[paramnum].Type == REGT_INT";
    goto LAB_00653cc4;
  }
  if (numparam == 4) {
    pcVar9 = "(paramnum) < numparam";
LAB_00653ce3:
    __assert_fail(pcVar9,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x120d,"int AF_A_CheckForReload(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                 );
  }
  if ((param[4].field_0.field_3.Type != '\x03') ||
     ((iVar2 = param[3].field_0.i, param[4].field_0.field_1.atag != 7 &&
      (param[4].field_0.field_1.a != (void *)0x0)))) {
    pcVar9 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATE || param[paramnum].a == NULL)"
    ;
    goto LAB_00653ce3;
  }
  val = param[4].field_0.field_1.a;
  if (5 < numparam) {
    VVar1 = param[5].field_0.field_3.Type;
    if (VVar1 == '\0') {
      bVar10 = param[5].field_0.i != 0;
      goto LAB_00653bf8;
    }
    if (VVar1 != 0xff) {
      __assert_fail("param[paramnum].Type == REGT_INT",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x120e,
                    "int AF_A_CheckForReload(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  bVar10 = false;
LAB_00653bf8:
  if (0 < numret) {
    VMReturn::SetPointer(ret,(void *)0x0,7);
    numret = 1;
  }
  this = *(AWeapon **)(puVar3[0x40] + 0xd0);
  iVar8 = 1;
  if (!(bool)(bVar10 & this->ReloadCounter == 0)) {
    iVar8 = (this->ReloadCounter + 1) % iVar2;
  }
  if (iVar8 == 0) {
    AWeapon::CheckAmmo(this,0,false,false,-1);
  }
  else if (numret != 0) {
    VMReturn::SetPointer(ret,val,7);
  }
  if (!bVar10) {
    this->ReloadCounter = iVar8;
  }
  return numret;
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_CheckForReload)
{
	PARAM_ACTION_PROLOGUE;

	if ( self->player == NULL || self->player->ReadyWeapon == NULL )
	{
		ACTION_RETURN_STATE(NULL);
	}
	PARAM_INT		(count);
	PARAM_STATE		(jump);
	PARAM_BOOL_OPT	(dontincrement)		{ dontincrement = false; }

	if (numret > 0)
	{
		ret->SetPointer(NULL, ATAG_STATE);
		numret = 1;
	}

	AWeapon *weapon = self->player->ReadyWeapon;

	int ReloadCounter = weapon->ReloadCounter;
	if (!dontincrement || ReloadCounter != 0)
		ReloadCounter = (weapon->ReloadCounter+1) % count;
	else // 0 % 1 = 1?  So how do we check if the weapon was never fired?  We should only do this when we're not incrementing the counter though.
		ReloadCounter = 1;

	// If we have not made our last shot...
	if (ReloadCounter != 0)
	{
		// Go back to the refire frames, instead of continuing on to the reload frames.
		if (numret != 0)
		{
			ret->SetPointer(jump, ATAG_STATE);
		}
	}
	else
	{
		// We need to reload. However, don't reload if we're out of ammo.
		weapon->CheckAmmo(false, false);
	}
	if (!dontincrement)
	{
		weapon->ReloadCounter = ReloadCounter;
	}
	return numret;
}